

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall clinet::on_accept(clinet *this,int netid,int error)

{
  login_req req;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 *local_38;
  undefined4 local_30;
  undefined8 *local_28;
  undefined4 local_20;
  
  if (error == 0) {
    this->netid_ = netid;
    puts(&DAT_00107262);
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    printf(anon_var_dwarf_f1);
    __isoc99_scanf("%s",&local_58);
    local_38 = &local_5c;
    local_5c = 1;
    local_30 = 4;
    local_20 = 0x20;
    local_28 = &local_58;
    (*this->network_->_vptr_inetwork[4])(this->network_,(ulong)(uint)this->netid_,&local_38,2);
    return;
  }
  __assert_fail("error == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                ,0x17,"virtual void clinet::on_accept(int, int)");
}

Assistant:

void on_accept(int netid, int error) override
    {
        assert(error == 0);
        netid_ = netid;
        printf("连接服务器成功\n");

        login_req req = { 0 };
        printf("请先给自己起个名字：");
        scanf("%s", req.name);
        send_message(MSG_LOGIN_REQ, &req, sizeof(req));
    }